

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qradiobutton.cpp
# Opt level: O0

void __thiscall QRadioButton::initStyleOption(QRadioButton *this,QStyleOptionButton *option)

{
  long lVar1;
  bool bVar2;
  QWidget *this_00;
  QSize this_01;
  StateFlag other;
  QWidget *in_RSI;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QRadioButtonPrivate *d;
  WidgetAttribute attribute;
  QStyleOption *this_02;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QWidget *)0x0) {
    this_02 = in_RDI;
    this_00 = (QWidget *)d_func((QRadioButton *)0x667df1);
    attribute = (WidgetAttribute)((ulong)in_RDI >> 0x20);
    QStyleOption::initFrom(this_02,in_RSI);
    QString::operator=((QString *)&in_RSI[1].data,(QString *)(this_00 + 0xf));
    QIcon::operator=((QIcon *)&in_RSI[2].super_QPaintDevice,(QIcon *)&this_00[0xf].field_0x18);
    this_01 = QAbstractButton::iconSize((QAbstractButton *)in_RSI);
    *(int *)&in_RSI[2].field_0x18 = this_01.wd.m_i;
    *(int *)&in_RSI[2].field_0x1c = this_01.ht.m_i;
    if (((byte)this_00[0x10].field_0xc >> 4 & 1) != 0) {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_Sunken);
    }
    other = State_Off;
    if (((byte)this_00[0x10].field_0xc >> 1 & 1) != 0) {
      other = State_On;
    }
    QFlags<QStyle::StateFlag>::operator|=((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,other);
    bVar2 = QWidget::testAttribute(this_00,attribute);
    if ((bVar2) && (bVar2 = QWidget::underMouse((QWidget *)0x667ed0), bVar2)) {
      QFlags<QStyle::StateFlag>::setFlag
                ((QFlags<QStyle::StateFlag> *)this_01,(StateFlag)((ulong)this_02 >> 0x20),
                 SUB81((ulong)this_02 >> 0x18,0));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRadioButton::initStyleOption(QStyleOptionButton *option) const
{
    if (!option)
        return;
    Q_D(const QRadioButton);
    option->initFrom(this);
    option->text = d->text;
    option->icon = d->icon;
    option->iconSize = iconSize();
    if (d->down)
        option->state |= QStyle::State_Sunken;
    option->state |= (d->checked) ? QStyle::State_On : QStyle::State_Off;
    if (testAttribute(Qt::WA_Hover) && underMouse()) {
        option->state.setFlag(QStyle::State_MouseOver, d->hovering);
    }
}